

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

void __thiscall NetworkNS::Grid::Grid(Grid *this,double Lx,double Ly,double Lz,int nx,int ny,int nz)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  grid_cell *pgVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  double *pdVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int *piVar31;
  int iVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  int local_d8;
  int local_cc;
  long local_b8;
  int local_98;
  int local_90;
  
  this->_vptr_Grid = (_func_int **)&PTR__Grid_0010fd28;
  this->ncellx = nx;
  this->ncelly = ny;
  this->ncellz = nz;
  iVar5 = ny * nx * nz;
  this->ncells = iVar5;
  pgVar8 = (grid_cell *)malloc((long)iVar5 * 0x90);
  this->cells = pgVar8;
  dVar33 = Lx / (double)nx;
  this->dlx = dVar33;
  this->idlx = 1.0 / dVar33;
  dVar34 = Ly / (double)ny;
  this->dly = dVar34;
  this->idly = 1.0 / dVar34;
  dVar35 = Lz / (double)nz;
  this->dlz = dVar35;
  this->idlz = 1.0 / dVar35;
  dVar35 = dVar34 * dVar33 * dVar35;
  this->vcell = dVar35;
  this->ivcell = 1.0 / dVar35;
  if (0 < nz) {
    dVar33 = this->dlx;
    dVar34 = this->dly;
    dVar35 = this->dlz;
    iVar5 = 0;
    iVar13 = 0;
    iVar16 = 0;
    do {
      if (0 < ny) {
        iVar21 = 0;
        iVar23 = iVar5;
        do {
          if (0 < nx) {
            pdVar26 = pgVar8[iVar13].Vec + 2;
            iVar28 = 0;
            do {
              ((grid_cell *)(pdVar26 + -3))->Id = iVar23 + iVar28;
              iVar28 = iVar28 + 1;
              pdVar26[-2] = (double)iVar28 * dVar33;
              pdVar26[-1] = (double)(iVar21 + 1) * dVar34;
              *pdVar26 = (double)(iVar16 + 1) * dVar35;
              pdVar26 = pdVar26 + 0x12;
            } while (nx != iVar28);
            iVar13 = iVar13 + iVar28;
          }
          iVar21 = iVar21 + 1;
          iVar23 = iVar23 + nx;
        } while (iVar21 != ny);
      }
      iVar16 = iVar16 + 1;
      iVar5 = iVar5 + ny * nx;
    } while (iVar16 != nz);
  }
  lVar9 = (long)this->ncellz;
  if (0 < lVar9) {
    uVar2 = this->ncellx;
    uVar14 = (ulong)uVar2;
    uVar3 = this->ncelly;
    uVar6 = uVar2 * uVar3;
    local_b8 = 0;
    local_cc = 0;
    lVar27 = 0;
    do {
      lVar10 = lVar27 + 1;
      if (0 < (int)uVar3) {
        iVar5 = (int)lVar27 + -1;
        if (lVar27 == 0) {
          iVar5 = (int)(lVar9 + -1);
        }
        local_98 = (int)lVar10;
        iVar13 = 0;
        if (lVar27 < lVar9 + -1) {
          iVar13 = local_98;
        }
        iVar16 = (int)lVar27 * uVar3;
        iVar23 = uVar3 * iVar13;
        iVar21 = uVar3 * iVar5;
        uVar11 = (ulong)(iVar5 * uVar6);
        uVar24 = (ulong)(iVar13 * uVar6);
        lVar27 = local_b8;
        uVar19 = 0;
        do {
          uVar20 = uVar19 + 1;
          if (0 < (int)uVar2) {
            local_d8 = (int)lVar27;
            piVar31 = pgVar8[local_d8].neigh + 0x1a;
            iVar5 = (int)uVar19;
            iVar13 = iVar5 + -1;
            if (uVar19 == 0) {
              iVar13 = (int)((long)(int)uVar3 + -1);
            }
            local_90 = (int)uVar20;
            iVar28 = 0;
            if ((long)uVar19 < (long)(int)uVar3 + -1) {
              iVar28 = local_90;
            }
            iVar17 = (iVar16 + iVar5) * uVar2;
            iVar18 = (iVar28 + iVar16) * uVar2;
            iVar7 = (iVar16 + iVar13) * uVar2;
            iVar15 = (iVar23 + iVar5) * uVar2;
            iVar32 = (iVar23 + iVar28) * uVar2;
            iVar22 = (iVar23 + iVar13) * uVar2;
            iVar25 = (iVar21 + iVar5) * uVar2;
            iVar30 = (iVar21 + iVar28) * uVar2;
            iVar5 = (iVar21 + iVar13) * uVar2;
            uVar19 = 0;
            do {
              uVar1 = uVar19 + 1;
              iVar29 = 0;
              if ((long)uVar19 < (long)(int)uVar2 + -1) {
                iVar29 = (int)uVar1;
              }
              iVar4 = (int)uVar19;
              iVar12 = iVar4 + -1;
              if (uVar1 == 1) {
                iVar12 = (int)((long)(int)uVar2 + -1);
              }
              piVar31[-0x1a] = local_d8 + iVar4;
              piVar31[-0x19] = iVar17 + iVar29;
              piVar31[-0x18] = iVar17 + iVar12;
              piVar31[-0x17] = (iVar28 + local_cc) * uVar2 + iVar4;
              piVar31[-0x16] = (iVar13 + local_cc) * uVar2 + iVar4;
              piVar31[-0x15] = iVar18 + iVar29;
              piVar31[-0x14] = iVar18 + iVar12;
              piVar31[-0x13] = iVar7 + iVar29;
              piVar31[-0x12] = iVar7 + iVar12;
              piVar31[-0x11] = (int)uVar24 + iVar4;
              piVar31[-0x10] = iVar15 + iVar29;
              piVar31[-0xf] = iVar15 + iVar12;
              piVar31[-0xe] = iVar32 + iVar4;
              piVar31[-0xd] = iVar22 + iVar4;
              piVar31[-0xc] = iVar32 + iVar29;
              piVar31[-0xb] = iVar32 + iVar12;
              piVar31[-10] = iVar22 + iVar29;
              piVar31[-9] = iVar22 + iVar12;
              piVar31[-8] = (int)uVar11 + iVar4;
              piVar31[-7] = iVar25 + iVar29;
              piVar31[-6] = iVar25 + iVar12;
              piVar31[-5] = iVar30 + iVar4;
              piVar31[-4] = iVar4 + iVar5;
              piVar31[-3] = iVar30 + iVar29;
              piVar31[-2] = iVar30 + iVar12;
              piVar31[-1] = iVar29 + iVar5;
              *piVar31 = iVar12 + iVar5;
              piVar31 = piVar31 + 0x24;
              uVar19 = uVar1;
            } while (uVar1 != uVar14);
          }
          uVar11 = uVar11 + uVar14;
          uVar24 = uVar24 + uVar14;
          lVar27 = lVar27 + uVar14;
          uVar19 = uVar20;
        } while (uVar20 != uVar3);
      }
      local_cc = local_cc + uVar3;
      local_b8 = local_b8 + (ulong)uVar6;
      lVar27 = lVar10;
    } while (lVar10 != lVar9);
  }
  return;
}

Assistant:

Grid::Grid(double Lx, double Ly, double Lz, int nx, int ny, int nz) {

      /* Initialize the arrays with the cells: */
      ncellx = nx;
      ncelly = ny;
      ncellz = nz;
      ncells = ncellx * ncelly * ncellz;
      cells = (grid_cell*)malloc(ncells * sizeof(grid_cell));

      /*define dlx, dly, dlz and vecell: all of these are common parameters for each subcell
       *  and thus they are defined only once*/

      dlx = Lx / double(ncellx);
      idlx = 1.0 / dlx;
      dly = Ly / double(ncelly);
      idly = 1.0 / dly;
      dlz = Lz / double(ncellz);
      idlz = 1.0 / dlz;
      vcell = dlx * dly*dlz;
      ivcell = 1.0 / vcell;

      int counter = 0;
      //define Id, and the vector of each cell

      for (int k = 0; k < ncellz; k++) 

         for (int j = 0; j < ncelly; j++) 

            for (int i = 0; i < ncellx; i++) {


               cells[counter].Id = k * ncelly * ncellx + j * ncellx + i;
               cells[counter].Vec[0] = double(i + 1) * dlx;
               cells[counter].Vec[1] = double(j + 1) * dly;
               cells[counter].Vec[2] = double(k + 1) * dlz;


              
               counter = counter + 1;
            }

         

      

      //define the first neighbours of all nodes 


      int icell, jcell, kcell, klower, kupper, jlower, jupper, ilower, iupper, c_id;

      for (kcell = 0; kcell < ncellz; kcell++) {

         kupper = kcell + 1;
         if ((kcell + 1)>(ncellz - 1)) kupper = 0;
         klower = kcell - 1;
         if ((kcell - 1) < 0) klower = ncellz - 1;

         for (jcell = 0; jcell < ncelly; jcell++) {

            jupper = jcell + 1;
            if ((jcell + 1)>(ncelly - 1)) jupper = 0;
            jlower = jcell - 1;
            if ((jcell - 1) < 0) jlower = ncelly - 1;


            for (icell = 0; icell < ncellx; icell++) {

               iupper = icell + 1;
               if ((icell + 1)>(ncellx - 1)) iupper = 0;
               ilower = icell - 1;
               if ((icell - 1) < 0) ilower = ncellx - 1;

               c_id = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;

               // 1: z, y , x:
               //neigh[cell_id][0] = (kcell)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[0] = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;
               //2: same z, same y, x+
               //neigh[cell_id][1] = (kcell)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[1] = (kcell) * ncelly * ncellx + (jcell) * ncellx + iupper;
               // 3: same z, same y, x-
               //neigh[cell_id][2] = (kcell)*ncelly*ncellx + (jcell)*ncellx + ilower;  
               cells[c_id].neigh[2] = (kcell) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //4: same z, y+ , same x
               //neigh[cell_id][3] = (kcell)*ncelly*ncellx + (jupper)*ncellx + icell; 
               cells[c_id].neigh[3] = (kcell) * ncelly * ncellx + (jupper) * ncellx + icell;
               //5: same z, y- , same x
               //neigh[cell_id][4] = (kcell)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[4] = (kcell) * ncelly * ncellx + (jlower) * ncellx + icell;
               //6: same z, y+ , x+
               //neigh[cell_id][5] = (kcell)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[5] = (kcell) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //7: same z, y+ , x-
               //neigh[cell_id][6] = (kcell)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[6] = (kcell) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //8: same z, y-, x+
               //neigh[cell_id][7] = (kcell)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[7] = (kcell) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //9: same z, y-, x-
               //neigh[cell_id][8] = (kcell)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[8] = (kcell) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //10: z+1, y, x :
               //neigh[cell_id][9] = (kupper)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[9] = (kupper) * ncelly * ncellx + (jcell) * ncellx + icell;
               //11: z+1, same y, x+
               //neigh[cell_id][10] = (kupper)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[10] = (kupper) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //12: z+1, same y, x-
               //neigh[cell_id][11] = (kupper)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[11] = (kupper) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //13: z+1, y+ , same x
               //neigh[cell_id][12] = (kupper)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[12] = (kupper) * ncelly * ncellx + (jupper) * ncellx + icell;
               //14: z+1, y- , same x
               //neigh[cell_id][13] = (kupper)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[13] = (kupper) * ncelly * ncellx + (jlower) * ncellx + icell;
               //15: z+1, y+ , x+
               //neigh[cell_id][14] = (kupper)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[14] = (kupper) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //16: z+1, y+ , x-
               //neigh[cell_id][15] = (kupper)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[15] = (kupper) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //17: z+1, y-, x+
               //neigh[cell_id][16] = (kupper)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[16] = (kupper) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //18: z+1, y-, x-
               //neigh[cell_id][17] = (kupper)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[17] = (kupper) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //19: z-1, y, x :
               //neigh[cell_id][18] = (klower)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[18] = (klower) * ncelly * ncellx + (jcell) * ncellx + icell;
               //20: z-1, same y, x+
               //neigh[cell_id][19] = (klower)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[19] = (klower) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //21: z-1, same y, x-
               //neigh[cell_id][20] = (klower)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[20] = (klower) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //22: z-1, y+ , same x
               //neigh[cell_id][21] = (klower)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[21] = (klower) * ncelly * ncellx + (jupper) * ncellx + icell;
               //23: z-1, y- , same x
               //neigh[cell_id][22] = (klower)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[22] = (klower) * ncelly * ncellx + (jlower) * ncellx + icell;
               //24: z-1, y+ , x+
               //neigh[cell_id][23] = (klower)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[23] = (klower) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //25: z-1, y+ , x-
               //neigh[cell_id][24] = (klower)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[24] = (klower) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //26: z-1, y-, x+
               //neigh[cell_id][25] = (klower)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[25] = (klower) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //27: z-1, y-, x-
               //neigh[cell_id][26] = (klower)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[26] = (klower) * ncelly * ncellx + (jlower) * ncellx + ilower;

            }

         }

      }



   }